

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging_cfg.c
# Opt level: O1

void oonf_logcfg_schema_help(cfg_schema_entry *entry,autobuf *out)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  
  cfg_append_printable_line(out,"    Parameter must be on of the following list:");
  abuf_puts(out,"    ");
  sVar1 = oonf_log_get_sourcecount();
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      pcVar2 = ", ";
      if (uVar3 == 0) {
        pcVar2 = "";
      }
      abuf_appendf(out,"%s\'%s\'",pcVar2,LOG_SOURCE_NAMES[uVar3]);
      uVar3 = uVar3 + 1;
      sVar1 = oonf_log_get_sourcecount();
    } while (uVar3 < sVar1);
  }
  abuf_puts(out,"\n");
  return;
}

Assistant:

void
oonf_logcfg_schema_help(const struct cfg_schema_entry *entry __attribute__((unused)), struct autobuf *out) {
  size_t i;

  cfg_append_printable_line(out, "    Parameter must be on of the following list:");

  abuf_puts(out, "    ");
  for (i = 0; i < oonf_log_get_sourcecount(); i++) {
    abuf_appendf(out, "%s'%s'", i == 0 ? "" : ", ", LOG_SOURCE_NAMES[i]);
  }
  abuf_puts(out, "\n");
}